

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Ptr<Catch::IStreamingReporter> __thiscall
Catch::addListeners(Catch *this,Ptr<const_Catch::IConfig> *config,
                   Ptr<Catch::IStreamingReporter> *reporters)

{
  bool bVar1;
  int iVar2;
  IRegistryHub *pIVar3;
  undefined4 extraout_var;
  vector<Catch::Ptr<Catch::IReporterFactory>,_std::allocator<Catch::Ptr<Catch::IReporterFactory>_>_>
  *__x;
  reference this_00;
  IReporterFactory *pIVar4;
  undefined4 extraout_var_00;
  ReporterConfig local_88 [2];
  Ptr<Catch::IStreamingReporter> local_68;
  Ptr<Catch::IStreamingReporter> local_60;
  __normal_iterator<Catch::Ptr<Catch::IReporterFactory>_*,_std::vector<Catch::Ptr<Catch::IReporterFactory>,_std::allocator<Catch::Ptr<Catch::IReporterFactory>_>_>_>
  local_58;
  __normal_iterator<const_Catch::Ptr<Catch::IReporterFactory>_*,_std::vector<Catch::Ptr<Catch::IReporterFactory>,_std::allocator<Catch::Ptr<Catch::IReporterFactory>_>_>_>
  local_50;
  const_iterator itEnd;
  __normal_iterator<const_Catch::Ptr<Catch::IReporterFactory>_*,_std::vector<Catch::Ptr<Catch::IReporterFactory>,_std::allocator<Catch::Ptr<Catch::IReporterFactory>_>_>_>
  local_40;
  const_iterator it;
  Listeners listeners;
  Ptr<Catch::IStreamingReporter> *reporters_local;
  Ptr<const_Catch::IConfig> *config_local;
  
  pIVar3 = getRegistryHub();
  iVar2 = (*pIVar3->_vptr_IRegistryHub[2])();
  __x = (vector<Catch::Ptr<Catch::IReporterFactory>,_std::allocator<Catch::Ptr<Catch::IReporterFactory>_>_>
         *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x20))();
  std::
  vector<Catch::Ptr<Catch::IReporterFactory>,_std::allocator<Catch::Ptr<Catch::IReporterFactory>_>_>
  ::vector((vector<Catch::Ptr<Catch::IReporterFactory>,_std::allocator<Catch::Ptr<Catch::IReporterFactory>_>_>
            *)&it,__x);
  itEnd._M_current =
       (Ptr<Catch::IReporterFactory> *)
       std::
       vector<Catch::Ptr<Catch::IReporterFactory>,_std::allocator<Catch::Ptr<Catch::IReporterFactory>_>_>
       ::begin((vector<Catch::Ptr<Catch::IReporterFactory>,_std::allocator<Catch::Ptr<Catch::IReporterFactory>_>_>
                *)&it);
  __gnu_cxx::
  __normal_iterator<Catch::Ptr<Catch::IReporterFactory>const*,std::vector<Catch::Ptr<Catch::IReporterFactory>,std::allocator<Catch::Ptr<Catch::IReporterFactory>>>>
  ::__normal_iterator<Catch::Ptr<Catch::IReporterFactory>*>
            ((__normal_iterator<Catch::Ptr<Catch::IReporterFactory>const*,std::vector<Catch::Ptr<Catch::IReporterFactory>,std::allocator<Catch::Ptr<Catch::IReporterFactory>>>>
              *)&local_40,
             (__normal_iterator<Catch::Ptr<Catch::IReporterFactory>_*,_std::vector<Catch::Ptr<Catch::IReporterFactory>,_std::allocator<Catch::Ptr<Catch::IReporterFactory>_>_>_>
              *)&itEnd);
  local_58._M_current =
       (Ptr<Catch::IReporterFactory> *)
       std::
       vector<Catch::Ptr<Catch::IReporterFactory>,_std::allocator<Catch::Ptr<Catch::IReporterFactory>_>_>
       ::end((vector<Catch::Ptr<Catch::IReporterFactory>,_std::allocator<Catch::Ptr<Catch::IReporterFactory>_>_>
              *)&it);
  __gnu_cxx::
  __normal_iterator<Catch::Ptr<Catch::IReporterFactory>const*,std::vector<Catch::Ptr<Catch::IReporterFactory>,std::allocator<Catch::Ptr<Catch::IReporterFactory>>>>
  ::__normal_iterator<Catch::Ptr<Catch::IReporterFactory>*>
            ((__normal_iterator<Catch::Ptr<Catch::IReporterFactory>const*,std::vector<Catch::Ptr<Catch::IReporterFactory>,std::allocator<Catch::Ptr<Catch::IReporterFactory>>>>
              *)&local_50,&local_58);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&local_40,&local_50);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<const_Catch::Ptr<Catch::IReporterFactory>_*,_std::vector<Catch::Ptr<Catch::IReporterFactory>,_std::allocator<Catch::Ptr<Catch::IReporterFactory>_>_>_>
              ::operator*(&local_40);
    pIVar4 = Ptr<Catch::IReporterFactory>::operator->(this_00);
    ReporterConfig::ReporterConfig(local_88,config);
    iVar2 = (*(pIVar4->super_IShared).super_NonCopyable._vptr_NonCopyable[4])(pIVar4,local_88);
    Ptr<Catch::IStreamingReporter>::Ptr
              (&local_68,(IStreamingReporter *)CONCAT44(extraout_var_00,iVar2));
    addReporter((Catch *)&local_60,reporters,&local_68);
    Ptr<Catch::IStreamingReporter>::operator=(reporters,&local_60);
    Ptr<Catch::IStreamingReporter>::~Ptr(&local_60);
    Ptr<Catch::IStreamingReporter>::~Ptr(&local_68);
    ReporterConfig::~ReporterConfig(local_88);
    __gnu_cxx::
    __normal_iterator<const_Catch::Ptr<Catch::IReporterFactory>_*,_std::vector<Catch::Ptr<Catch::IReporterFactory>,_std::allocator<Catch::Ptr<Catch::IReporterFactory>_>_>_>
    ::operator++(&local_40);
  }
  Ptr<Catch::IStreamingReporter>::Ptr((Ptr<Catch::IStreamingReporter> *)this,reporters);
  std::
  vector<Catch::Ptr<Catch::IReporterFactory>,_std::allocator<Catch::Ptr<Catch::IReporterFactory>_>_>
  ::~vector((vector<Catch::Ptr<Catch::IReporterFactory>,_std::allocator<Catch::Ptr<Catch::IReporterFactory>_>_>
             *)&it);
  return (Ptr<Catch::IStreamingReporter>)(IStreamingReporter *)this;
}

Assistant:

Ptr<IStreamingReporter> addListeners( Ptr<IConfig const> const& config, Ptr<IStreamingReporter> reporters ) {
        IReporterRegistry::Listeners listeners = getRegistryHub().getReporterRegistry().getListeners();
        for( IReporterRegistry::Listeners::const_iterator it = listeners.begin(), itEnd = listeners.end();
                it != itEnd;
                ++it )
            reporters = addReporter(reporters, (*it)->create( ReporterConfig( config ) ) );
        return reporters;
    }